

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O0

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createAlloc(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  PSNodeAlloc *val;
  PSNode *node_00;
  uint64_t s;
  PSNodesSeq *pPVar1;
  LLVMPointerGraphBuilder *in_RSI;
  AllocaInst *AI;
  PSNodeAlloc *node;
  AllocaInst *in_stack_00000038;
  PSNode *in_stack_ffffffffffffffd0;
  SubgraphNode<dg::pta::PSNode> *this_00;
  
  PointerGraph::create<(dg::pta::PSNodeType)1>((PointerGraph *)in_stack_ffffffffffffffd0);
  val = PSNodeAlloc::get<dg::pta::PSNode>(in_stack_ffffffffffffffd0);
  node_00 = (PSNode *)
            llvm::dyn_cast<llvm::AllocaInst,llvm::Instruction_const>
                      ((Instruction *)in_stack_ffffffffffffffd0);
  if (node_00 != (PSNode *)0x0) {
    this_00 = &(val->super_PSNode).super_SubgraphNode<dg::pta::PSNode>;
    llvm::Module::getDataLayout();
    s = llvmutils::getAllocatedSize(in_stack_00000038,(DataLayout *)this);
    SubgraphNode<dg::pta::PSNode>::setSize(this_00,s);
  }
  pPVar1 = addNode(in_RSI,(Value *)val,node_00);
  return pPVar1;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createAlloc(const llvm::Instruction *Inst) {
    PSNodeAlloc *node = PSNodeAlloc::get(PS.create<PSNodeType::ALLOC>());

    const llvm::AllocaInst *AI = llvm::dyn_cast<llvm::AllocaInst>(Inst);
    if (AI)
        node->setSize(llvmutils::getAllocatedSize(AI, &M->getDataLayout()));

    return addNode(Inst, node);
}